

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O1

DWORD SearchPathW(LPCWSTR lpPath,LPCWSTR lpFileName,LPCWSTR lpExtension,DWORD nBufferLength,
                 LPWSTR lpBuffer,LPWSTR *lpFilePart)

{
  bool bVar1;
  undefined8 uVar2;
  DWORD DVar3;
  int iVar4;
  DWORD DVar5;
  size_t sVar6;
  size_t sVar7;
  char16_t *pcVar8;
  size_t __n;
  char *__format;
  char16_t *pcVar9;
  SIZE_T SVar10;
  ulong count;
  long in_FS_OFFSET;
  undefined1 local_170 [8];
  PathWCharString FullPathPS;
  undefined1 local_108 [8];
  PathWCharString CanonicalPathPS;
  LPCWSTR local_88;
  undefined1 local_78 [8];
  PathCharString AnsiPathPS;
  
  AnsiPathPS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  FullPathPS._64_8_ = local_170;
  FullPathPS.m_size = 0;
  AnsiPathPS._32_8_ = local_78;
  AnsiPathPS.m_size = 0;
  CanonicalPathPS._64_8_ = local_108;
  CanonicalPathPS.m_size = 0;
  CanonicalPathPS.m_count = (SIZE_T)lpBuffer;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00330f4e;
  if (lpPath == (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","SearchPathW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x577);
    __format = "lpPath may not be NULL\n";
LAB_00330a3f:
    DVar5 = 0x57;
    fprintf(_stderr,__format);
LAB_00330a55:
    SetLastError(DVar5);
    DVar5 = 0;
  }
  else {
    if (lpFileName == (LPCWSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x57d);
      __format = "lpFileName may not be NULL\n";
      goto LAB_00330a3f;
    }
    if (lpExtension != (LPCWSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x583);
      DVar5 = 0x57;
      fprintf(_stderr,"lpExtension must be NULL, is %p instead\n",lpExtension);
      goto LAB_00330a55;
    }
    if ((*lpFileName == L'\\') || (*lpFileName == L'/')) {
      StackString<32UL,_char16_t>::Resize((StackString<32UL,_char16_t> *)local_108,0x400);
      local_88 = (LPCWSTR)CanonicalPathPS._64_8_;
      DVar5 = 8;
      if (CanonicalPathPS._64_8_ != 0) {
        DVar3 = GetFullPathNameW(lpFileName,0x401,(LPWSTR)CanonicalPathPS._64_8_,(LPWSTR *)0x0);
        if (DVar3 < CanonicalPathPS.m_size) {
          CanonicalPathPS.m_size = (ulong)DVar3;
        }
        *(undefined2 *)(CanonicalPathPS._64_8_ + CanonicalPathPS.m_size * 2) = 0;
        if (0x401 < DVar3) {
          StackString<32UL,_char16_t>::Resize
                    ((StackString<32UL,_char16_t> *)local_108,(ulong)(DVar3 - 1));
          local_88 = (LPCWSTR)CanonicalPathPS._64_8_;
          if (CanonicalPathPS._64_8_ == 0) goto LAB_00330a55;
          DVar3 = GetFullPathNameW(lpFileName,DVar3,(LPWSTR)CanonicalPathPS._64_8_,(LPWSTR *)0x0);
          if (DVar3 < CanonicalPathPS.m_size) {
            CanonicalPathPS.m_size = (ulong)DVar3;
          }
          *(undefined2 *)(CanonicalPathPS._64_8_ + CanonicalPathPS.m_size * 2) = 0;
        }
        if (DVar3 == 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00330f4e;
          DVar5 = 0x57;
          GetLastError();
        }
        else {
          sVar6 = PAL_wcslen(local_88);
          SVar10 = (long)MaxWCharToAcpLengthRatio * (sVar6 + 1);
          StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_78,SVar10);
          uVar2 = AnsiPathPS._32_8_;
          if (AnsiPathPS._32_8_ != 0) {
            iVar4 = WideCharToMultiByte(0,0,local_88,-1,(LPSTR)AnsiPathPS._32_8_,(int)SVar10,
                                        (LPCSTR)0x0,(LPBOOL)0x0);
            if ((ulong)(long)iVar4 < AnsiPathPS.m_size) {
              AnsiPathPS.m_size = (long)iVar4;
            }
            *(undefined1 *)(AnsiPathPS._32_8_ + AnsiPathPS.m_size) = 0;
            iVar4 = access((char *)uVar2,0);
            DVar5 = (DWORD)(iVar4 == 0);
            goto LAB_00330ec1;
          }
        }
      }
      goto LAB_00330a55;
    }
    sVar6 = PAL_wcslen(lpFileName);
    bVar1 = true;
    if (*lpPath == L'\0') {
      DVar5 = 0;
      local_88 = lpPath;
    }
    else {
      do {
        while( true ) {
          pcVar8 = PAL_wcschr(lpPath,L':');
          if (pcVar8 == (char16_t *)0x0) {
            sVar7 = PAL_wcslen(lpPath);
            pcVar8 = lpPath + sVar7;
            pcVar9 = pcVar8;
          }
          else {
            pcVar9 = pcVar8 + 1;
          }
          __n = (long)pcVar8 - (long)lpPath;
          count = ((long)__n >> 1) + sVar6 + 1;
          if (count < 0x400) break;
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00330f4e;
LAB_00330c9e:
          lpPath = pcVar9;
          if (*pcVar9 == L'\0') {
            DVar5 = 0;
            goto LAB_00330eb7;
          }
        }
        if (pcVar8 == lpPath) goto LAB_00330c9e;
        StackString<32UL,_char16_t>::Resize((StackString<32UL,_char16_t> *)local_170,count);
        if (FullPathPS._64_8_ == 0) {
          DVar5 = 0;
          SetLastError(8);
          bVar1 = false;
          break;
        }
        FullPathPS.m_count = FullPathPS._64_8_;
        memcpy((void *)FullPathPS._64_8_,lpPath,__n);
        SVar10 = FullPathPS.m_count;
        *(undefined2 *)(FullPathPS.m_count + __n) = 0x2f;
        PAL_wcscpy((undefined2 *)(FullPathPS.m_count + __n) + 1,lpFileName);
        if (count < FullPathPS.m_size) {
          FullPathPS.m_size = count;
        }
        *(undefined2 *)(FullPathPS._64_8_ + FullPathPS.m_size * 2) = 0;
        StackString<32UL,_char16_t>::Resize((StackString<32UL,_char16_t> *)local_108,0x400);
        if (CanonicalPathPS._64_8_ == 0) {
LAB_00330f98:
          SetLastError(8);
          DVar5 = 0;
          local_88 = (LPCWSTR)0x0;
          bVar1 = false;
          break;
        }
        local_88 = (LPCWSTR)CanonicalPathPS._64_8_;
        DVar5 = GetFullPathNameW((LPCWSTR)SVar10,0x401,(LPWSTR)CanonicalPathPS._64_8_,(LPWSTR *)0x0)
        ;
        if (DVar5 < CanonicalPathPS.m_size) {
          CanonicalPathPS.m_size = (ulong)DVar5;
        }
        *(undefined2 *)(CanonicalPathPS._64_8_ + CanonicalPathPS.m_size * 2) = 0;
        if (0x401 < DVar5) {
          StackString<32UL,_char16_t>::Resize
                    ((StackString<32UL,_char16_t> *)local_108,(ulong)(DVar5 - 1));
          if (CanonicalPathPS._64_8_ == 0) goto LAB_00330f98;
          local_88 = (LPCWSTR)CanonicalPathPS._64_8_;
          DVar5 = GetFullPathNameW((LPCWSTR)SVar10,DVar5,(LPWSTR)CanonicalPathPS._64_8_,
                                   (LPWSTR *)0x0);
          if (DVar5 < CanonicalPathPS.m_size) {
            CanonicalPathPS.m_size = (ulong)DVar5;
          }
          *(undefined2 *)(CanonicalPathPS._64_8_ + CanonicalPathPS.m_size * 2) = 0;
        }
        if (DVar5 == 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00330f4e;
          GetLastError();
        }
        else {
          sVar7 = PAL_wcslen(local_88);
          SVar10 = (long)MaxWCharToAcpLengthRatio * (sVar7 + 1);
          StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_78,SVar10);
          uVar2 = AnsiPathPS._32_8_;
          if (AnsiPathPS._32_8_ == 0) {
            DVar5 = 0;
            SetLastError(8);
            bVar1 = false;
            break;
          }
          iVar4 = WideCharToMultiByte(0,0,local_88,-1,(LPSTR)AnsiPathPS._32_8_,(int)SVar10,
                                      (LPCSTR)0x0,(LPBOOL)0x0);
          if ((ulong)(long)iVar4 < AnsiPathPS.m_size) {
            AnsiPathPS.m_size = (long)iVar4;
          }
          *(undefined1 *)(AnsiPathPS._32_8_ + AnsiPathPS.m_size) = 0;
          iVar4 = access((char *)uVar2,0);
          if (iVar4 == 0) break;
        }
        DVar5 = 0;
        lpPath = pcVar9;
      } while (*pcVar9 != L'\0');
    }
LAB_00330eb7:
    if (bVar1) {
LAB_00330ec1:
      if (DVar5 == 0) {
        DVar5 = 2;
        goto LAB_00330a55;
      }
      sVar6 = PAL_wcslen(local_88);
      DVar3 = (DWORD)sVar6;
      DVar5 = DVar3 + 1;
      if (DVar3 + 1 <= nBufferLength) {
        if (CanonicalPathPS.m_count == 0) {
          DVar5 = 0x57;
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00330f4e;
          goto LAB_00330a55;
        }
        PAL_wcscpy((char16_t *)CanonicalPathPS.m_count,local_88);
        DVar5 = DVar3;
        if (lpFilePart != (LPWSTR *)0x0) {
          pcVar8 = PAL_wcsrchr((char16_t *)CanonicalPathPS.m_count,L'/');
          *lpFilePart = pcVar8;
          if (pcVar8 == (char16_t *)0x0) {
            fprintf(_stderr,"] %s %s:%d","SearchPathW",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                    ,0x64b);
            fprintf(_stderr,"no \'/\' in full path!\n");
          }
          else {
            *lpFilePart = pcVar8 + 1;
          }
        }
      }
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char16_t>::~StackString((StackString<32UL,_char16_t> *)local_108);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_78);
    StackString<32UL,_char16_t>::~StackString((StackString<32UL,_char16_t> *)local_170);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != AnsiPathPS.m_count) {
      __stack_chk_fail();
    }
    return DVar5;
  }
LAB_00330f4e:
  abort();
}

Assistant:

DWORD
PALAPI
SearchPathW(
    IN LPCWSTR lpPath,
    IN LPCWSTR lpFileName,
    IN LPCWSTR lpExtension,
    IN DWORD nBufferLength,
    OUT LPWSTR lpBuffer,
    OUT LPWSTR *lpFilePart
    )
{
    DWORD nRet = 0;
    WCHAR * FullPath;
    size_t FullPathLength = 0;
    PathWCharString FullPathPS;
    LPCWSTR pPathStart;
    LPCWSTR pPathEnd;
    size_t PathLength;
    size_t FileNameLength;
    DWORD dw;
    DWORD length;
    char * AnsiPath;
    PathCharString AnsiPathPS;
    size_t CanonicalPathLength;
    int canonical_size;
    WCHAR * CanonicalPath;
    PathWCharString CanonicalPathPS;

    PERF_ENTRY(SearchPathW);
    ENTRY("SearchPathW(lpPath=%p (%S), lpFileName=%p (%S), lpExtension=%p, "
          "nBufferLength=%u, lpBuffer=%p, lpFilePart=%p)\n",
	  lpPath,
	  lpPath, lpFileName, lpFileName, lpExtension, nBufferLength, lpBuffer,
          lpFilePart);

    /* validate parameters */

    if(NULL == lpPath)
    {
        ASSERT("lpPath may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL == lpFileName)
    {
        ASSERT("lpFileName may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL != lpExtension)
    {
        ASSERT("lpExtension must be NULL, is %p instead\n", lpExtension);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    /* special case : if file name contains absolute path, don't search the
       provided path */
    if('\\' == lpFileName[0] || '/' == lpFileName[0])
    {
        /* Canonicalize the path to deal with back-to-back '/', etc. */
        length = MAX_LONGPATH;
        CanonicalPath = CanonicalPathPS.OpenStringBuffer(length);
        if (NULL == CanonicalPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        dw = GetFullPathNameW(lpFileName, length+1, CanonicalPath, NULL);
        CanonicalPathPS.CloseBuffer(dw);
        if (length+1 < dw)
        {
            CanonicalPath = CanonicalPathPS.OpenStringBuffer(dw-1);
            if (NULL == CanonicalPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameW(lpFileName, dw, CanonicalPath, NULL);
            CanonicalPathPS.CloseBuffer(dw);
        }

        if (dw == 0)
        {
            WARN("couldn't canonicalize path <%S>, error is %#x. failing.\n",
                 lpPath, GetLastError());
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }

        /* see if the file exists */
        CanonicalPathLength = (PAL_wcslen(CanonicalPath)+1) * MaxWCharToAcpLengthRatio;
        AnsiPath = AnsiPathPS.OpenStringBuffer(CanonicalPathLength);
        if (NULL == AnsiPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
	    canonical_size = WideCharToMultiByte(CP_ACP, 0, CanonicalPath, -1,
			    AnsiPath, CanonicalPathLength, NULL, NULL);
	    AnsiPathPS.CloseBuffer(canonical_size);

        if(0 == access(AnsiPath, F_OK))
        {
            /* found it */
            nRet = dw;
        }
    }
    else
    {
        LPCWSTR pNextPath;

        pNextPath = lpPath;

        FileNameLength = PAL_wcslen(lpFileName);

        while (*pNextPath)
        {
            pPathStart = pNextPath;

            /* get a pointer to the end of the first path in pPathStart */
            pPathEnd = PAL_wcschr(pPathStart, ':');
            if (!pPathEnd)
            {
                pPathEnd = pPathStart + PAL_wcslen(pPathStart);
                /* we want to break out of the loop after this pass, so let
                   *pNextPath be '\0' */
                pNextPath = pPathEnd;
            }
            else
            {
                /* point to the next component in the path string */
                pNextPath = pPathEnd+1;
            }

            PathLength = pPathEnd-pPathStart;

            if (PathLength+FileNameLength+1 >= MAX_LONGPATH)
            {
                /* The path+'/'+file length is too long.  Skip it. */
                WARN("path component %.*S is too long, skipping it\n",
                     (int)PathLength, pPathStart);
                continue;
            }
            else if(0 == PathLength)
            {
                /* empty component : there were 2 consecutive ':' */
                continue;
            }

            /* Construct a pathname by concatenating one path from lpPath, '/'
               and lpFileName */
            FullPathLength = PathLength + FileNameLength;
            FullPath = FullPathPS.OpenStringBuffer(FullPathLength+1);
            if (NULL == FullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            memcpy(FullPath, pPathStart, PathLength*sizeof(WCHAR));
            FullPath[PathLength] = '/';
            PAL_wcscpy(&FullPath[PathLength+1], lpFileName);

            FullPathPS.CloseBuffer(FullPathLength+1);

            /* Canonicalize the path to deal with back-to-back '/', etc. */
            length = MAX_LONGPATH;
            CanonicalPath = CanonicalPathPS.OpenStringBuffer(length);
            if (NULL == CanonicalPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameW(FullPath, length+1,
                                  CanonicalPath, NULL);
            CanonicalPathPS.CloseBuffer(dw);

            if (length+1 < dw)
            {
                CanonicalPath = CanonicalPathPS.OpenStringBuffer(dw-1);
                if (NULL == CanonicalPath)
                {
                    SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    goto done;
                }
                dw = GetFullPathNameW(FullPath, dw, CanonicalPath, NULL);
                CanonicalPathPS.CloseBuffer(dw);
            }

            if (dw == 0)
            {
                /* Call failed - possibly low memory.  Skip the path */
                WARN("couldn't canonicalize path <%S>, error is %#x. "
                     "skipping it\n", FullPath, GetLastError());
                continue;
            }

            /* see if the file exists */
            CanonicalPathLength = (PAL_wcslen(CanonicalPath)+1) * MaxWCharToAcpLengthRatio;
            AnsiPath = AnsiPathPS.OpenStringBuffer(CanonicalPathLength);
            if (NULL == AnsiPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            canonical_size = WideCharToMultiByte(CP_ACP, 0, CanonicalPath, -1,
                                AnsiPath, CanonicalPathLength, NULL, NULL);
            AnsiPathPS.CloseBuffer(canonical_size);

            if(0 == access(AnsiPath, F_OK))
            {
                /* found it */
                nRet = dw;
                break;
            }
        }
    }

    if (nRet == 0)
    {
       /* file not found anywhere; say so. in Windows, this always seems to say
          FILE_NOT_FOUND, even if path doesn't exist */
       SetLastError(ERROR_FILE_NOT_FOUND);
    }
    else
    {
        /* find out the required buffer size, copy path to buffer if it's
           large enough */
        nRet = PAL_wcslen(CanonicalPath)+1;
        if(nRet <= nBufferLength)
        {
            if(NULL == lpBuffer)
            {
                /* Windows merily crashes here, but let's not */
                ERROR("caller told us buffer size was %d, but buffer is NULL\n",
                      nBufferLength);
                SetLastError(ERROR_INVALID_PARAMETER);
                nRet = 0;
                goto done;
            }
            PAL_wcscpy(lpBuffer, CanonicalPath);

            /* don't include the null-terminator in the count if buffer was
               large enough */
            nRet--;

            if(NULL != lpFilePart)
            {
                *lpFilePart = PAL_wcsrchr(lpBuffer, '/');
                if(NULL == *lpFilePart)
                {
                    ASSERT("no '/' in full path!\n");
                }
                else
                {
                    /* point to character after last '/' */
                    (*lpFilePart)++;
                }
            }
        }
    }
done:
    LOGEXIT("SearchPathW returns DWORD %u\n", nRet);
    PERF_EXIT(SearchPathW);
    return nRet;
}